

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O1

tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
* __thiscall polyscope::CameraExtrinsics::getCameraFrame(CameraExtrinsics *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *p_Var8;
  int i;
  long lVar9;
  int j;
  int iVar10;
  tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *in_RDI;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *paVar11;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *paVar12;
  undefined1 auVar13 [16];
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  mat3x3 R;
  
  lVar9 = 0;
  do {
    iVar10 = 0;
    do {
      paVar11 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                &(this->E).value[lVar9].field_3;
      if (((iVar10 != 3) && (paVar11 = &(this->E).value[lVar9].field_2, iVar10 != 2)) &&
         (paVar11 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                    ((this->E).value + lVar9), iVar10 == 1)) {
        paVar11 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                  &(this->E).value[lVar9].field_1;
      }
      paVar12 = &local_44 + lVar9 * 3 + 2;
      if ((iVar10 != 2) && (paVar12 = &local_44 + lVar9 * 3, iVar10 == 1)) {
        paVar12 = &local_44 + lVar9 * 3 + 1;
      }
      *paVar12 = *paVar11;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 3);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  auVar13 = ZEXT816(0) << 0x40;
  auVar2 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)local_44),
                           ZEXT416((uint)(local_40 * 0.0)));
  auVar3 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)local_38),
                           ZEXT416((uint)(local_34 * 0.0)));
  auVar2 = vinsertps_avx(ZEXT416((uint)(auVar2._0_4_ - local_3c)),
                         ZEXT416((uint)(auVar3._0_4_ - local_30)),0x10);
  auVar4 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)local_2c),
                           ZEXT416((uint)(local_28 * 0.0)));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)local_40),ZEXT416((uint)local_44),auVar13);
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)local_3c),auVar13);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)local_34),ZEXT416((uint)local_38),auVar13);
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_30),auVar13);
  auVar3 = vinsertps_avx(auVar3,auVar5,0x10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)local_28),ZEXT416((uint)local_2c),auVar13);
  auVar6 = vfmadd231ss_fma(auVar5,ZEXT416((uint)R.value[0].field_0),auVar13);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_40 * 0.0 + local_44.z)),auVar13,
                           ZEXT416((uint)local_3c));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_34 * 0.0 + local_38)),auVar13,
                           ZEXT416((uint)local_30));
  auVar5 = vinsertps_avx(auVar5,auVar7,0x10);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_28 * 0.0 + local_2c)),
                           ZEXT416((uint)R.value[0].field_0),auVar13);
  uVar1 = vmovlps_avx(auVar5);
  p_Var8 = &(in_RDI->
            super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
            ).
            super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ;
  (p_Var8->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (p_Var8->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       auVar7._0_4_;
  uVar1 = vmovlps_avx(auVar3);
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       auVar6._0_4_;
  uVar1 = vmovlps_avx(auVar2);
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
       auVar4._0_4_ - R.value[0].field_0.x;
  return in_RDI;
}

Assistant:

std::tuple<glm::vec3, glm::vec3, glm::vec3> CameraExtrinsics::getCameraFrame() const {

  glm::mat3x3 R;
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R[i][j] = E[i][j];
    }
  }
  glm::mat3x3 Rt = glm::transpose(R);

  glm::vec3 lookDir = Rt * glm::vec3(0.0, 0.0, -1.0);
  glm::vec3 upDir = Rt * glm::vec3(0.0, 1.0, 0.0);
  glm::vec3 rightDir = Rt * glm::vec3(1.0, 0.0, 0.0);

  return std::tuple<glm::vec3, glm::vec3, glm::vec3>{lookDir, upDir, rightDir};
}